

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O1

ostream * __thiscall
wasm::ValidationInfo::fail<wasm::Name,std::__cxx11::string>
          (ValidationInfo *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *text,Name curr,
          Function *func)

{
  ostringstream *this_00;
  ostream *poVar1;
  char *pcVar2;
  Name name;
  
  LOCK();
  (this->valid)._M_base._M_i = false;
  UNLOCK();
  pcVar2 = curr.super_IString.str._M_str;
  this_00 = getStream_abi_cxx11_(this,func);
  if (this->quiet == false) {
    this_00 = printFailureHeader_abi_cxx11_(this,func);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)this_00,(text->_M_dataplus)._M_p,text->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", on \n",6);
    name.super_IString.str._M_str = pcVar2;
    name.super_IString.str._M_len = (size_t)curr.super_IString.str._M_str;
    poVar1 = wasm::operator<<((wasm *)this_00,curr.super_IString.str._M_len,name);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  return (ostream *)this_00;
}

Assistant:

std::ostream& fail(S text, T curr, Function* func) {
    valid.store(false);
    auto& stream = getStream(func);
    if (quiet) {
      return stream;
    }
    auto& ret = printFailureHeader(func);
    ret << text << ", on \n";
    return printModuleComponent(curr, ret, wasm);
  }